

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O1

int Saig_StrSimCountMatchedNodes(Aig_Man_t *p)

{
  void *pvVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  
  lVar3 = (long)p->vObjs->nSize;
  if (0 < lVar3) {
    lVar4 = 0;
    iVar2 = 0;
    do {
      pvVar1 = p->vObjs->pArray[lVar4];
      if ((pvVar1 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar1 + 0x18) & 7) - 7)) {
        if (p->pReprs == (Aig_Obj_t **)0x0) {
          uVar5 = 0;
        }
        else {
          uVar5 = (uint)(p->pReprs[*(int *)((long)pvVar1 + 0x24)] != (Aig_Obj_t *)0x0);
        }
        iVar2 = iVar2 + uVar5;
      }
      lVar4 = lVar4 + 1;
    } while (lVar3 != lVar4);
    return iVar2;
  }
  return 0;
}

Assistant:

int Saig_StrSimCountMatchedNodes( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    Aig_ManForEachNode( p, pObj, i )
        if ( Aig_ObjRepr(p, pObj) )
            Counter++;
    return Counter;
}